

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O0

void DSP_Cursor(LispPTR *args,int argnum)

{
  int argnum_local;
  LispPTR *args_local;
  
  Set_XCursor(*args & 0xffff,args[1] & 0xffff);
  return;
}

Assistant:

void DSP_Cursor(LispPTR *args, int argnum)
/* args[0] :	hot spot X
 * args[1] :	hot spot Y
 */
{
  extern int ScreenLocked;
  extern DLword *EmCursorX68K, *EmCursorY68K;
  extern int LastCursorX, LastCursorY;


#if defined(XWINDOW)
  /* For X-Windows, set the cursor to the given location. */
  Set_XCursor((int)(args[0] & 0xFFFF), (int)(args[1] & 0xFFFF));
#elif defined(SDL)
  sdl_setCursor((int)(args[0] & 0xFFFF), (int)(args[1] & 0xFFFF));
#endif /* XWINDOW */
}